

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_acbp_v2.cpp
# Opt level: O3

void __thiscall intel_acbp_v2_t::pmda_entry_v3_t::_read(pmda_entry_v3_t *this)

{
  hash_t *phVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  hash_t *this_00;
  
  uVar3 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
  this->m_entry_id = uVar3;
  uVar3 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
  this->m_base = uVar3;
  uVar3 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
  this->m_size = uVar3;
  uVar2 = kaitai::kstream::read_u2le((this->super_kstruct).m__io);
  this->m_total_entry_size = uVar2;
  uVar2 = kaitai::kstream::read_u2le((this->super_kstruct).m__io);
  this->m_version = uVar2;
  this_00 = (hash_t *)operator_new(0x48);
  hash_t::hash_t(this_00,(this->super_kstruct).m__io,&this->super_kstruct,this->m__root);
  phVar1 = (this->m_hash)._M_t.
           super___uniq_ptr_impl<intel_acbp_v2_t::hash_t,_std::default_delete<intel_acbp_v2_t::hash_t>_>
           ._M_t.
           super__Tuple_impl<0UL,_intel_acbp_v2_t::hash_t_*,_std::default_delete<intel_acbp_v2_t::hash_t>_>
           .super__Head_base<0UL,_intel_acbp_v2_t::hash_t_*,_false>._M_head_impl;
  (this->m_hash)._M_t.
  super___uniq_ptr_impl<intel_acbp_v2_t::hash_t,_std::default_delete<intel_acbp_v2_t::hash_t>_>._M_t
  .super__Tuple_impl<0UL,_intel_acbp_v2_t::hash_t_*,_std::default_delete<intel_acbp_v2_t::hash_t>_>.
  super__Head_base<0UL,_intel_acbp_v2_t::hash_t_*,_false>._M_head_impl = this_00;
  if (phVar1 != (hash_t *)0x0) {
    (**(code **)((long)(phVar1->super_kstruct)._vptr_kstruct + 8))();
    return;
  }
  return;
}

Assistant:

void intel_acbp_v2_t::pmda_entry_v3_t::_read() {
    m_entry_id = m__io->read_u4le();
    m_base = m__io->read_u4le();
    m_size = m__io->read_u4le();
    m_total_entry_size = m__io->read_u2le();
    m_version = m__io->read_u2le();
    m_hash = std::unique_ptr<hash_t>(new hash_t(m__io, this, m__root));
}